

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O2

int GetMonitorPhysicalWidth(int monitor)

{
  GLFWmonitor **ppGVar1;
  int iVar2;
  int monitorCount;
  int width;
  
  width = 0;
  monitorCount = 0;
  ppGVar1 = glfwGetMonitors(&monitorCount);
  if ((monitor < 0) || (monitorCount <= monitor)) {
    iVar2 = 0;
    TraceLog(4,"GLFW: Failed to find selected monitor");
  }
  else {
    glfwGetMonitorPhysicalSize(ppGVar1[(uint)monitor],&width,(int *)0x0);
    iVar2 = width;
  }
  return iVar2;
}

Assistant:

int GetMonitorPhysicalWidth(int monitor)
{
    int width = 0;
    int monitorCount = 0;
    GLFWmonitor **monitors = glfwGetMonitors(&monitorCount);

    if ((monitor >= 0) && (monitor < monitorCount)) glfwGetMonitorPhysicalSize(monitors[monitor], &width, NULL);
    else TRACELOG(LOG_WARNING, "GLFW: Failed to find selected monitor");

    return width;
}